

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

void __thiscall llvm::detail::IEEEFloat::IEEEFloat(IEEEFloat *this,fltSemantics *ourSemantics)

{
  fltSemantics *ourSemantics_local;
  IEEEFloat *this_local;
  
  initialize(this,ourSemantics);
  this->field_0x12 = this->field_0x12 & 0xf8 | 3;
  this->field_0x12 = this->field_0x12 & 0xf7;
  return;
}

Assistant:

IEEEFloat::IEEEFloat(const fltSemantics &ourSemantics) {
  initialize(&ourSemantics);
  category = fcZero;
  sign = false;
}